

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materialized_relation.cpp
# Opt level: O2

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::MaterializedRelation::GetTableRef(MaterializedRelation *this)

{
  ColumnDefinition *pCVar1;
  pointer pCVar2;
  string *__x;
  pointer *__ptr;
  long *in_RSI;
  ColumnDefinition *col;
  ColumnDefinition *this_00;
  _Head_base<0UL,_duckdb::ColumnDataRef_*,_false> local_58;
  string local_50 [32];
  
  make_uniq<duckdb::ColumnDataRef,duckdb::shared_ptr<duckdb::ColumnDataCollection,true>&>
            ((duckdb *)&local_58,(shared_ptr<duckdb::ColumnDataCollection,_true> *)(in_RSI + 0x14));
  pCVar1 = (ColumnDefinition *)in_RSI[0xe];
  for (this_00 = (ColumnDefinition *)in_RSI[0xd]; this_00 != pCVar1; this_00 = this_00 + 1) {
    pCVar2 = unique_ptr<duckdb::ColumnDataRef,_std::default_delete<duckdb::ColumnDataRef>,_true>::
             operator->((unique_ptr<duckdb::ColumnDataRef,_std::default_delete<duckdb::ColumnDataRef>,_true>
                         *)&local_58);
    __x = ColumnDefinition::Name_abi_cxx11_(this_00);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&pCVar2->expected_names,__x);
  }
  (**(code **)(*in_RSI + 0x28))(local_50);
  pCVar2 = unique_ptr<duckdb::ColumnDataRef,_std::default_delete<duckdb::ColumnDataRef>,_true>::
           operator->((unique_ptr<duckdb::ColumnDataRef,_std::default_delete<duckdb::ColumnDataRef>,_true>
                       *)&local_58);
  ::std::__cxx11::string::operator=((string *)&(pCVar2->super_TableRef).alias,local_50);
  ::std::__cxx11::string::~string(local_50);
  (this->super_Relation)._vptr_Relation = (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> MaterializedRelation::GetTableRef() {
	auto table_ref = make_uniq<ColumnDataRef>(collection);
	for (auto &col : columns) {
		table_ref->expected_names.push_back(col.Name());
	}
	table_ref->alias = GetAlias();
	return std::move(table_ref);
}